

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.h
# Opt level: O0

char * __thiscall
MeCab::CharProperty::seekToOtherType
          (CharProperty *this,char *begin,char *end,CharInfo c,CharInfo *fail,size_t *mblen,
          size_t *clen)

{
  CharInfo in_ECX;
  char *in_RDX;
  char *in_RSI;
  CharProperty *in_R8;
  long *in_R9;
  long *in_stack_00000008;
  char *p;
  bool local_49;
  CharInfo in_stack_ffffffffffffffc0;
  CharInfo in_stack_ffffffffffffffc4;
  CharInfo local_4;
  
  *in_stack_00000008 = 0;
  local_4 = in_ECX;
  while( true ) {
    local_49 = false;
    if (in_RSI != in_RDX) {
      in_stack_ffffffffffffffc0 =
           getCharInfo(in_R8,(char *)in_R9,in_RSI,
                       (size_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      *(CharInfo *)&in_R8->_vptr_CharProperty = in_stack_ffffffffffffffc0;
      in_stack_ffffffffffffffc4 = *(CharInfo *)&in_R8->_vptr_CharProperty;
      local_49 = CharInfo::isKindOf(&local_4,in_stack_ffffffffffffffc4);
    }
    if (local_49 == false) break;
    in_RSI = in_RSI + *in_R9;
    *in_stack_00000008 = *in_stack_00000008 + 1;
    local_4 = *(CharInfo *)&in_R8->_vptr_CharProperty;
  }
  return in_RSI;
}

Assistant:

inline const char *seekToOtherType(const char *begin, const char *end,
                                     CharInfo c, CharInfo *fail,
                                     size_t *mblen, size_t *clen) const {
    register const char *p =  begin;
    *clen = 0;
    while (p != end && c.isKindOf(*fail = getCharInfo(p, end, mblen))) {
      p += *mblen;
      ++(*clen);
      c = *fail;
    }
    return p;
  }